

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_time.cpp
# Opt level: O1

bool __thiscall booster::locale::date_time::operator<=(date_time *this,date_time *other)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  uint extraout_EDX;
  uint extraout_EDX_00;
  
  iVar1 = (*((this->impl_).ptr_)->_vptr_abstract_calendar[5])();
  iVar2 = (*((other->impl_).ptr_)->_vptr_abstract_calendar[5])();
  return CONCAT44(extraout_var,iVar1) < CONCAT44(extraout_var_00,iVar2) ||
         extraout_EDX <= extraout_EDX_00 &&
         CONCAT44(extraout_var,iVar1) <= CONCAT44(extraout_var_00,iVar2);
}

Assistant:

bool date_time::operator<=(date_time const &other) const
{
    return !(*this>other);
}